

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

array<float,_3>
pbrt::SampleSphericalTriangle(array<pbrt::Point3<float>,_3> *v,Point3f *p,Point2f *u,Float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  char *args;
  long in_FS_OFFSET;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar33 [56];
  undefined1 auVar32 [64];
  undefined1 auVar34 [16];
  undefined1 auVar36 [60];
  undefined1 auVar35 [64];
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  Vector3<float> VVar46;
  array<float,_3> aVar47;
  float va;
  float fStack_124;
  float local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  int vb;
  float local_e0;
  undefined1 local_d8 [16];
  float local_c4;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  if (pdf != (Float *)0x0) {
    *pdf = 0.0;
  }
  uVar9._0_4_ = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar9._4_4_ = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar9;
  fVar26 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar15 = vinsertps_avx(*(undefined1 (*) [16])(v->values + 1),
                          ZEXT416((uint)v->values[0].super_Tuple3<pbrt::Point3,_float>.y),0x10);
  uVar11 = _vb >> 0x20;
  fVar44 = v->values[0].super_Tuple3<pbrt::Point3,_float>.x - (float)(undefined4)uVar9;
  fVar42 = v->values[0].super_Tuple3<pbrt::Point3,_float>.z - fVar26;
  auVar20 = vsubps_avx(auVar15,auVar19);
  auVar15._0_4_ = auVar20._0_4_ * auVar20._0_4_;
  auVar15._4_4_ = auVar20._4_4_ * auVar20._4_4_;
  auVar15._8_4_ = auVar20._8_4_ * auVar20._8_4_;
  auVar15._12_4_ = auVar20._12_4_ * auVar20._12_4_;
  auVar15 = vmovshdup_avx(auVar15);
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar42),ZEXT416((uint)fVar42));
  va = auVar15._0_4_;
  if (auVar15._0_4_ <= 0.0) {
    args = "LengthSquared(a)";
    iVar12 = 0x2c;
  }
  else {
    auVar19 = vmovshdup_avx(auVar19);
    fVar45 = v->values[1].super_Tuple3<pbrt::Point3,_float>.z - fVar26;
    fVar43 = v->values[1].super_Tuple3<pbrt::Point3,_float>.y - auVar19._0_4_;
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar43)),auVar20,auVar20);
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar45),ZEXT416((uint)fVar45));
    va = auVar14._0_4_;
    if (auVar14._0_4_ <= 0.0) {
      args = "LengthSquared(b)";
      iVar12 = 0x2d;
    }
    else {
      fVar41 = v->values[2].super_Tuple3<pbrt::Point3,_float>.x - (float)(undefined4)uVar9;
      fVar25 = v->values[2].super_Tuple3<pbrt::Point3,_float>.y - auVar19._0_4_;
      fVar26 = v->values[2].super_Tuple3<pbrt::Point3,_float>.z - fVar26;
      fVar13 = 0.0;
      _vb = uVar11 << 0x20;
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),ZEXT416((uint)fVar41),
                                ZEXT416((uint)fVar41));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      va = auVar19._0_4_;
      if (0.0 < auVar19._0_4_) {
        auVar15 = vinsertps_avx(auVar14,auVar15,0x10);
        auVar14 = vsqrtps_avx(auVar15);
        auVar15 = vmovshdup_avx(auVar14);
        auVar22._0_4_ = fVar43 / auVar14._0_4_;
        auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar23._0_4_ = fVar45 / auVar14._0_4_;
        auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar42 = fVar42 / auVar15._0_4_;
        auVar28 = ZEXT416((uint)fVar42);
        fVar44 = fVar44 / auVar15._0_4_;
        auVar24 = ZEXT416((uint)fVar44);
        local_a8 = vdivps_avx(auVar20,auVar14);
        local_38 = vmovshdup_avx(local_a8);
        auVar15 = vfmsub213ss_fma(auVar23,local_38,ZEXT416((uint)(fVar42 * auVar22._0_4_)));
        auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar42 * auVar22._0_4_)),auVar28,auVar22);
        auVar14 = vaddss_avx512f(auVar15,auVar20);
        uVar27 = 0;
        auVar15 = vfmsub213ss_fma(local_a8,auVar28,ZEXT416((uint)(fVar44 * auVar23._0_4_)));
        auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(fVar44 * auVar23._0_4_)),auVar24,auVar23);
        fVar45 = auVar15._0_4_ + auVar20._0_4_;
        auVar20 = ZEXT416((uint)(local_38._0_4_ * local_a8._0_4_));
        auVar15 = vfmsub213ss_fma(auVar22,auVar24,auVar20);
        auVar20 = vfnmadd231ss_fma(auVar20,local_38,local_a8);
        fVar43 = auVar15._0_4_ + auVar20._0_4_;
        auVar15 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar45 * fVar45)),auVar14,auVar14);
        auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
        if ((auVar15._0_4_ != 0.0) || (NAN(auVar15._0_4_))) {
          auVar20 = vsqrtss_avx(auVar19,auVar19);
          auVar16 = vdivss_avx512f(ZEXT416((uint)fVar25),auVar20);
          auVar17 = vdivss_avx512f(ZEXT416((uint)fVar26),auVar20);
          auVar18 = vdivss_avx512f(ZEXT416((uint)fVar41),auVar20);
          auVar19 = vmulss_avx512f(auVar23,auVar16);
          auVar20 = vfmsub213ss_fma(auVar17,auVar22,auVar19);
          auVar19 = vfnmadd231ss_avx512f(auVar19,auVar23,auVar16);
          fVar26 = auVar20._0_4_ + auVar19._0_4_;
          auVar19 = vmulss_avx512f(local_a8,auVar17);
          auVar20 = vfmsub213ss_fma(auVar18,auVar23,auVar19);
          auVar19 = vfnmadd231ss_avx512f(auVar19,local_a8,auVar17);
          fVar41 = auVar20._0_4_ + auVar19._0_4_;
          auVar20 = vmulss_avx512f(auVar22,auVar18);
          auVar19 = vfmsub213ss_fma(auVar16,local_a8,auVar20);
          auVar21 = vfnmadd231ss_avx512f(auVar20,auVar22,auVar18);
          auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar41)),ZEXT416((uint)fVar26),
                                    ZEXT416((uint)fVar26));
          fVar25 = auVar19._0_4_ + auVar21._0_4_;
          fVar13 = 0.0;
          auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
          if ((auVar20._0_4_ != 0.0) || (NAN(auVar20._0_4_))) {
            auVar19 = vmulss_avx512f(local_38,auVar17);
            local_88._0_4_ = auVar22._0_4_;
            local_98._0_4_ = auVar23._0_4_;
            auVar22 = vfmsub213ss_avx512f(auVar28,auVar16,auVar19);
            auVar19 = vfnmadd231ss_avx512f(auVar19,auVar17,local_38);
            fVar40 = auVar22._0_4_ + auVar19._0_4_;
            auVar19 = vmulss_avx512f(auVar28,auVar18);
            auVar22 = vfmsub213ss_avx512f(auVar24,auVar17,auVar19);
            auVar19 = vfnmadd231ss_avx512f(auVar19,auVar18,auVar28);
            fVar39 = auVar22._0_4_ + auVar19._0_4_;
            auVar19 = vmulss_avx512f(auVar24,auVar16);
            auVar22 = vfmsub213ss_avx512f(local_38,auVar18,auVar19);
            auVar23 = vfnmadd231ss_avx512f(auVar19,auVar16,auVar24);
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar39)),ZEXT416((uint)fVar40),
                                      ZEXT416((uint)fVar40));
            fVar37 = auVar22._0_4_ + auVar23._0_4_;
            fVar13 = 0.0;
            auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
            if ((auVar19._0_4_ != 0.0) || (NAN(auVar19._0_4_))) {
              auVar15 = vsqrtss_avx(auVar15,auVar15);
              auVar20 = vsqrtss_avx(auVar20,auVar20);
              local_c4 = auVar17._0_4_;
              local_c0 = auVar16._0_4_;
              local_bc = auVar18._0_4_;
              local_78 = vdivss_avx512f(auVar14,auVar15);
              fVar45 = fVar45 / auVar15._0_4_;
              local_68 = ZEXT416((uint)fVar45);
              fVar43 = fVar43 / auVar15._0_4_;
              local_b8 = ZEXT416((uint)fVar43);
              fVar13 = auVar20._0_4_;
              local_108 = ZEXT416((uint)(fVar26 / fVar13));
              local_f8 = ZEXT416((uint)(fVar41 / fVar13));
              fVar25 = fVar25 / fVar13;
              auVar15 = vsqrtss_avx(auVar19,auVar19);
              fVar26 = auVar15._0_4_;
              fVar39 = fVar39 / fVar26;
              local_48 = ZEXT416((uint)fVar39);
              fVar40 = fVar40 / fVar26;
              local_58 = ZEXT416((uint)fVar40);
              fVar37 = fVar37 / fVar26;
              local_d8 = ZEXT416((uint)fVar37);
              auVar15 = vfnmsub231ss_fma(ZEXT416((uint)(fVar45 * fVar39)),local_78,local_58);
              auVar15 = vfnmadd231ss_fma(auVar15,local_b8,local_d8);
              if (0.0 <= auVar15._0_4_) {
                auVar15 = ZEXT416((uint)(-fVar40 - local_78._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)((-fVar39 - fVar45) * (-fVar39 - fVar45))),
                                          auVar15,auVar15);
                auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)(-fVar37 - fVar43)),
                                          ZEXT416((uint)(-fVar37 - fVar43)));
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar20 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
                auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                local_118._0_4_ =
                     asinf((float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_));
                local_118._0_4_ = (float)local_118._0_4_ + (float)local_118._0_4_;
              }
              else {
                auVar15 = ZEXT416((uint)(local_78._0_4_ - fVar40));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)((fVar45 - fVar39) * (fVar45 - fVar39))),
                                          auVar15,auVar15);
                auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)(fVar43 - fVar37)),
                                          ZEXT416((uint)(fVar43 - fVar37)));
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar20 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
                auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                auVar29._0_4_ =
                     asinf((float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_));
                auVar29._4_60_ = extraout_var;
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar29._0_16_,
                                          ZEXT416(0x40490fdb));
                local_118._0_4_ = auVar15._0_4_;
              }
              auVar15 = vfnmsub231ss_fma(ZEXT416((uint)((float)local_f8._0_4_ *
                                                       (float)local_68._0_4_)),local_108,local_78);
              auVar15 = vfnmadd231ss_fma(auVar15,ZEXT416((uint)fVar25),local_b8);
              if (0.0 <= auVar15._0_4_) {
                auVar15 = ZEXT416((uint)(-local_78._0_4_ - local_108._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)((-(float)local_68._0_4_ -
                                                         (float)local_f8._0_4_) *
                                                        (-(float)local_68._0_4_ -
                                                        (float)local_f8._0_4_))),auVar15,auVar15);
                auVar20 = ZEXT416((uint)(-local_b8._0_4_ - fVar25));
                auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar20 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
                auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                fVar26 = asinf((float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_));
                fVar26 = fVar26 + fVar26;
              }
              else {
                auVar15 = ZEXT416((uint)(local_108._0_4_ - local_78._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_f8._0_4_ -
                                                         (float)local_68._0_4_) *
                                                        ((float)local_f8._0_4_ -
                                                        (float)local_68._0_4_))),auVar15,auVar15);
                auVar20 = ZEXT416((uint)(fVar25 - local_b8._0_4_));
                auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar20 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
                auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                auVar30._0_4_ =
                     asinf((float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_));
                auVar30._4_60_ = extraout_var_00;
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar30._0_16_,
                                          ZEXT416(0x40490fdb));
                fVar26 = auVar15._0_4_;
              }
              local_b8._0_4_ = fVar26;
              auVar15 = vfnmsub231ss_fma(ZEXT416((uint)((float)local_48._0_4_ *
                                                       (float)local_f8._0_4_)),local_58,local_108);
              auVar15 = vfnmadd231ss_fma(auVar15,local_d8,ZEXT416((uint)fVar25));
              if (0.0 <= auVar15._0_4_) {
                auVar15 = ZEXT416((uint)(-local_108._0_4_ - local_58._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)((-(float)local_f8._0_4_ -
                                                         (float)local_48._0_4_) *
                                                        (-(float)local_f8._0_4_ -
                                                        (float)local_48._0_4_))),auVar15,auVar15);
                auVar20 = ZEXT416((uint)(-fVar25 - local_d8._0_4_));
                auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar20 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
                auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                fVar26 = asinf((float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_));
                fVar26 = fVar26 + fVar26;
              }
              else {
                auVar15 = ZEXT416((uint)(local_58._0_4_ - local_108._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_48._0_4_ -
                                                         (float)local_f8._0_4_) *
                                                        ((float)local_48._0_4_ -
                                                        (float)local_f8._0_4_))),auVar15,auVar15);
                auVar20 = ZEXT416((uint)(local_d8._0_4_ - fVar25));
                auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                auVar20 = ZEXT416((uint)(auVar15._0_4_ * 0.5));
                auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                auVar31._0_4_ =
                     asinf((float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_));
                auVar31._4_60_ = extraout_var_01;
                auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar31._0_16_,
                                          ZEXT416(0x40490fdb));
                fVar26 = auVar15._0_4_;
              }
              fVar26 = (float)local_118._0_4_ + (float)local_b8._0_4_ + fVar26 + -3.1415927;
              fVar13 = 0.0;
              uVar27 = 0;
              if (0.0 < fVar26) {
                if (pdf != (Float *)0x0) {
                  *pdf = 1.0 / fVar26;
                }
                fVar26 = fVar26 * (u->super_Tuple2<pbrt::Point2,_float>).x;
                fVar45 = cosf((float)local_118._0_4_);
                local_f8._0_4_ = fVar45;
                fVar45 = sinf((float)local_118._0_4_);
                local_108._0_4_ = fVar45;
                fVar45 = sinf(fVar26);
                local_118._0_4_ = fVar45;
                fVar45 = cosf(fVar26);
                auVar15 = vfmsub231ss_fma(ZEXT416((uint)(fVar45 * (float)local_108._0_4_)),
                                          ZEXT416((uint)local_118._0_4_),
                                          ZEXT416((uint)local_f8._0_4_));
                local_118._0_4_ = auVar15._0_4_;
                fVar45 = cosf(fVar26);
                local_d8._0_4_ = fVar45;
                fVar26 = sinf(fVar26);
                fVar45 = local_a8._0_4_;
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)((float)local_108._0_4_ * fVar26)),
                                          ZEXT416((uint)local_f8._0_4_),
                                          ZEXT416((uint)local_d8._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)((float)local_88._0_4_ *
                                                        (float)local_38._0_4_)),
                                          ZEXT416((uint)fVar44),local_a8);
                auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar42),
                                          ZEXT416((uint)local_98._0_4_));
                fVar26 = auVar20._0_4_ - (float)local_f8._0_4_;
                auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)local_108._0_4_),
                                          ZEXT416((uint)local_118._0_4_));
                auVar19 = vfmsub231ss_fma(ZEXT416((uint)((float)local_118._0_4_ * fVar26)),auVar15,
                                          auVar20);
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar26)),
                                          ZEXT416((uint)local_118._0_4_),auVar15);
                auVar15 = vfmsub213ss_fma(auVar19,ZEXT416((uint)local_f8._0_4_),auVar15);
                auVar20._0_4_ = auVar15._0_4_ / ((float)local_108._0_4_ * auVar20._0_4_);
                auVar20._4_12_ = auVar15._4_12_;
                if (NAN(auVar20._0_4_)) {
                  LogFatal<char_const(&)[17]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                             ,0x55,"Check failed: %s",(char (*) [17])"!IsNaN(cosBetap)");
                }
                auVar23 = ZEXT816(0) << 0x40;
                auVar22 = SUB6416(ZEXT464(0x3f800000),0);
                auVar15 = vminss_avx(auVar22,auVar20);
                uVar27 = vcmpss_avx512f(auVar20,SUB6416(ZEXT464(0xbf800000),0),1);
                bVar10 = (bool)((byte)uVar27 & 1);
                auVar14._4_12_ = auVar15._4_12_;
                auVar14._0_4_ = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * auVar15._0_4_);
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_c0 * (float)local_38._0_4_)),
                                          ZEXT416((uint)local_bc),ZEXT416((uint)fVar44));
                auVar19 = vfnmadd213ss_fma(auVar14,auVar14,auVar22);
                auVar20 = vfmadd231ss_fma(auVar15,ZEXT416((uint)local_c4),ZEXT416((uint)fVar42));
                auVar15 = vmaxss_avx(auVar19,auVar23);
                auVar15 = vsqrtss_avx(auVar15,auVar15);
                fVar41 = auVar20._0_4_;
                fVar26 = local_c0 - (float)local_38._0_4_ * fVar41;
                fVar43 = local_bc - fVar44 * fVar41;
                fVar41 = local_c4 - fVar42 * fVar41;
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar43),
                                          ZEXT416((uint)fVar43));
                auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
                auVar20 = vsqrtss_avx(auVar20,auVar20);
                fVar13 = auVar20._0_4_;
                fVar25 = auVar15._0_4_;
                local_118._0_4_ = fVar44 * auVar14._0_4_ + (fVar43 / fVar13) * fVar25;
                local_d8._0_4_ = (float)local_38._0_4_ * auVar14._0_4_ + (fVar26 / fVar13) * fVar25;
                fVar26 = fVar42 * auVar14._0_4_ + (fVar41 / fVar13) * fVar25;
                local_108._0_4_ = v->values[0].super_Tuple3<pbrt::Point3,_float>.z;
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)((float)local_88._0_4_ *
                                                        (float)local_d8._0_4_)),
                                          ZEXT416((uint)local_118._0_4_),local_a8);
                local_48._0_4_ = fVar26;
                auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar26),
                                          ZEXT416((uint)local_98._0_4_));
                auVar20 = vfnmadd132ss_fma(ZEXT416((uint)(1.0 - auVar15._0_4_)),auVar22,
                                           ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).y));
                local_68._0_4_ = auVar15._0_4_;
                uVar1 = v->values[0].super_Tuple3<pbrt::Point3,_float>.x;
                uVar5 = v->values[0].super_Tuple3<pbrt::Point3,_float>.y;
                local_f8._4_4_ = uVar5;
                local_f8._0_4_ = uVar1;
                local_f8._8_8_ = 0;
                fVar44 = auVar20._0_4_;
                uVar2 = v->values[1].super_Tuple3<pbrt::Point3,_float>.x;
                uVar6 = v->values[1].super_Tuple3<pbrt::Point3,_float>.y;
                auVar28._4_4_ = uVar6;
                auVar28._0_4_ = uVar2;
                auVar28._8_8_ = 0;
                auVar15 = vsubps_avx(auVar28,local_f8);
                _va = vmovlps_avx(auVar15);
                fVar26 = v->values[1].super_Tuple3<pbrt::Point3,_float>.z - (float)local_108._0_4_;
                local_78._0_4_ = v->values[2].super_Tuple3<pbrt::Point3,_float>.x;
                local_58._0_4_ = v->values[2].super_Tuple3<pbrt::Point3,_float>.y;
                local_b8._0_4_ = v->values[2].super_Tuple3<pbrt::Point3,_float>.z;
                local_120 = fVar26;
                if (SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                    ::reg == '\0') {
                  iVar12 = __cxa_guard_acquire(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                                ::reg);
                  fVar45 = local_a8._0_4_;
                  auVar23 = ZEXT816(0) << 0x40;
                  if (iVar12 != 0) {
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                ::reg,SampleSphericalTriangle(pstd::array<pbrt::
                                      Point3<float>,3>const&,pbrt::Point3<float>const&,pbrt::
                                      Point2<float>const&,float*)::$_0::__invoke(pbrt::
                                      StatsAccumulator__,(PixelAccumFunc)0x0);
                    __cxa_guard_release(&SampleSphericalTriangle(pstd::array<pbrt::Point3<float>,int>const&,pbrt::Point3<float>const&,pbrt::Point2<float>const&,float*)
                                         ::reg);
                    fVar45 = local_a8._0_4_;
                    auVar23 = ZEXT816(0) << 0x40;
                  }
                }
                *(long *)(in_FS_OFFSET + -0x120) = *(long *)(in_FS_OFFSET + -0x120) + 1;
                auVar20 = vfnmadd213ss_fma(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),
                                           ZEXT416(0x3f800000));
                local_118._0_4_ = (float)local_118._0_4_ - fVar45 * (float)local_68._0_4_;
                local_d8._0_4_ =
                     (float)local_d8._0_4_ - (float)local_88._0_4_ * (float)local_68._0_4_;
                auVar20 = vmaxss_avx(auVar20,auVar23);
                auVar20 = vsqrtss_avx(auVar20,auVar20);
                fVar43 = (float)local_48._0_4_ - (float)local_98._0_4_ * (float)local_68._0_4_;
                auVar19 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                                        (float)local_d8._0_4_)),
                                          ZEXT416((uint)local_118._0_4_),
                                          ZEXT416((uint)local_118._0_4_));
                auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
                auVar19 = vsqrtss_avx(auVar19,auVar19);
                fVar40 = auVar19._0_4_;
                fVar13 = auVar20._0_4_;
                fVar42 = (float)local_88._0_4_ * fVar44 + ((float)local_d8._0_4_ / fVar40) * fVar13;
                fVar45 = fVar45 * fVar44 + ((float)local_118._0_4_ / fVar40) * fVar13;
                fVar41 = (float)local_78._0_4_ - local_f8._0_4_;
                auVar20 = vmovshdup_avx(local_f8);
                fVar25 = (float)local_58._0_4_ - auVar20._0_4_;
                local_108._0_4_ = (float)local_b8._0_4_ - (float)local_108._0_4_;
                auVar19 = ZEXT416((uint)(fVar42 * fVar41));
                auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar25),ZEXT416((uint)fVar45),auVar19);
                local_118 = ZEXT416((uint)fVar42);
                auVar19 = vfnmadd231ss_fma(auVar19,local_118,ZEXT416((uint)fVar41));
                auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)((float)local_98._0_4_ * fVar44)),0x10
                                       );
                auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)((fVar43 / fVar40) * fVar13)),0x10);
                local_a8._0_4_ = auVar20._0_4_ + auVar19._0_4_;
                local_a8._4_4_ = auVar20._4_4_ + auVar19._4_4_;
                local_a8._8_4_ = auVar20._8_4_ + auVar19._8_4_;
                local_a8._12_4_ = auVar20._12_4_ + auVar19._12_4_;
                auVar20 = vmovshdup_avx(local_a8);
                auVar14 = ZEXT416((uint)(auVar20._0_4_ * fVar25));
                auVar19 = vfmsub213ss_fma(ZEXT416((uint)local_108._0_4_),local_118,auVar14);
                auVar14 = vfnmadd213ss_fma(ZEXT416((uint)fVar25),auVar20,auVar14);
                auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar41),auVar20,
                                          ZEXT416((uint)((float)local_108._0_4_ * fVar45)));
                auVar22 = vfnmadd213ss_fma(ZEXT416((uint)local_108._0_4_),ZEXT416((uint)fVar45),
                                           ZEXT416((uint)((float)local_108._0_4_ * fVar45)));
                fVar44 = auVar22._0_4_ + auVar20._0_4_;
                auVar20 = vmovshdup_avx(auVar15);
                local_108 = ZEXT416((uint)(auVar19._0_4_ + auVar14._0_4_));
                auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar44)),local_108,auVar15)
                ;
                auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar26),local_a8,auVar15);
                fVar26 = auVar15._0_4_;
                if ((fVar26 != 0.0) || (NAN(fVar26))) {
                  uVar3 = v->values[0].super_Tuple3<pbrt::Point3,_float>.x;
                  uVar7 = v->values[0].super_Tuple3<pbrt::Point3,_float>.y;
                  auVar21._4_4_ = uVar7;
                  auVar21._0_4_ = uVar3;
                  auVar21._8_8_ = 0;
                  local_88._0_4_ = 1.0 / fVar26;
                  local_88._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  uVar4 = (p->super_Tuple3<pbrt::Point3,_float>).x;
                  uVar8 = (p->super_Tuple3<pbrt::Point3,_float>).y;
                  auVar17._4_4_ = uVar8;
                  auVar17._0_4_ = uVar4;
                  auVar17._8_8_ = 0;
                  auVar19 = vsubps_avx(auVar17,auVar21);
                  auVar36 = ZEXT1260(auVar19._4_12_);
                  local_e0 = (p->super_Tuple3<pbrt::Point3,_float>).z -
                             v->values[0].super_Tuple3<pbrt::Point3,_float>.z;
                  auVar33 = (undefined1  [56])0x0;
                  _vb = vmovlps_avx(auVar19);
                  local_98 = ZEXT416((uint)local_e0);
                  local_f8 = ZEXT416((uint)fVar45);
                  local_d8 = ZEXT416((uint)fVar44);
                  VVar46 = Cross<float>((Vector3<float> *)&vb,(Vector3<float> *)&va);
                  auVar35._0_4_ = VVar46.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar35._4_60_ = auVar36;
                  auVar32._0_8_ = VVar46.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar32._8_56_ = auVar33;
                  auVar15 = vinsertps_avx(local_d8,ZEXT416((uint)local_118._0_4_),0x10);
                  auVar20 = vinsertps_avx(auVar32._0_16_,auVar19,0x4c);
                  auVar19 = vinsertps_avx(auVar19,auVar32._0_16_,0x1c);
                  auVar38._0_4_ = auVar15._0_4_ * auVar20._0_4_;
                  auVar38._4_4_ = auVar15._4_4_ * auVar20._4_4_;
                  auVar38._8_4_ = auVar15._8_4_ * auVar20._8_4_;
                  auVar38._12_4_ = auVar15._12_4_ * auVar20._12_4_;
                  auVar15 = vinsertps_avx(local_108,ZEXT416((uint)local_f8._0_4_),0x10);
                  auVar20 = vfmadd213ps_fma(auVar15,auVar19,auVar38);
                  auVar15 = vinsertps_avx(local_98,auVar35._0_16_,0x10);
                  auVar15 = vfmadd213ps_fma(local_a8,auVar15,auVar20);
                  auVar18._0_4_ = (float)local_88._0_4_ * auVar15._0_4_;
                  auVar18._4_4_ = (float)local_88._0_4_ * auVar15._4_4_;
                  auVar18._8_4_ = (float)local_88._0_4_ * auVar15._8_4_;
                  auVar18._12_4_ = (float)local_88._0_4_ * auVar15._12_4_;
                  uVar9 = vcmpps_avx512vl(auVar18,ZEXT816(0) << 0x20,5);
                  auVar34._8_4_ = 0x3f800000;
                  auVar34._0_8_ = 0x3f8000003f800000;
                  auVar34._12_4_ = 0x3f800000;
                  auVar15 = vminps_avx512vl(auVar34,auVar18);
                  fVar26 = (float)((uint)((byte)uVar9 & 1) * auVar15._0_4_);
                  auVar24._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar15._4_4_;
                  auVar24._0_4_ = fVar26;
                  auVar24._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar15._8_4_;
                  auVar24._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar15._12_4_;
                  auVar15 = vmovshdup_avx(auVar24);
                  fVar44 = auVar15._0_4_;
                  fVar42 = fVar26 / (fVar26 + fVar44);
                  bVar10 = 1.0 < fVar26 + fVar44;
                  fVar13 = (float)((uint)bVar10 * (int)(fVar44 / (fVar44 + fVar42)) +
                                  (uint)!bVar10 * (int)fVar44);
                  auVar16._4_12_ = auVar24._4_12_;
                  auVar16._0_4_ = (float)((uint)bVar10 * (int)fVar42 + (uint)!bVar10 * (int)fVar26);
                  auVar15 = vinsertps_avx(ZEXT416((uint)((1.0 - auVar16._0_4_) - fVar13)),auVar16,
                                          0x10);
                  uVar27 = auVar15._0_8_;
                }
                else {
                  uVar27 = 0x3eaaaaab3eaaaaab;
                  fVar13 = 0.33333334;
                  *(long *)(in_FS_OFFSET + -0x128) = *(long *)(in_FS_OFFSET + -0x128) + 1;
                }
              }
            }
          }
        }
        aVar47.values[2] = fVar13;
        aVar47.values[0] = (float)(int)uVar27;
        aVar47.values[1] = (float)(int)((ulong)uVar27 >> 0x20);
        return (array<float,_3>)aVar47.values;
      }
      args = "LengthSquared(c)";
      iVar12 = 0x2e;
    }
  }
  _vb = uVar11 << 0x20;
  LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],float&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
             ,iVar12,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [17])args,
             (char (*) [2])0x621a47,(char (*) [17])args,&va,(char (*) [2])0x621a47,&vb);
}

Assistant:

pstd::array<Float, 3> SampleSphericalTriangle(const pstd::array<Point3f, 3> &v,
                                              const Point3f &p, const Point2f &u,
                                              Float *pdf) {
    if (pdf != nullptr)
        *pdf = 0;
    // Compute vectors _a_, _b_, and _c_ to spherical triangle vertices
    Vector3f a(v[0] - p), b(v[1] - p), c(v[2] - p);
    CHECK_GT(LengthSquared(a), 0);
    CHECK_GT(LengthSquared(b), 0);
    CHECK_GT(LengthSquared(c), 0);
    a = Normalize(a);
    b = Normalize(b);
    c = Normalize(c);

    // Compute normalized cross products of all direction pairs
    Vector3f n_ab = Cross(a, b), n_bc = Cross(b, c), n_ca = Cross(c, a);
    if (LengthSquared(n_ab) == 0 || LengthSquared(n_bc) == 0 || LengthSquared(n_ca) == 0)
        return {};
    n_ab = Normalize(n_ab);
    n_bc = Normalize(n_bc);
    n_ca = Normalize(n_ca);

    // Compute angles $\alpha$, $\beta$, and $\gamma$ at spherical triangle vertices
    Float alpha = AngleBetween(n_ab, -n_ca);
    Float beta = AngleBetween(n_bc, -n_ab);
    Float gamma = AngleBetween(n_ca, -n_bc);

    // Uniformly sample triangle area $A$ to compute $A'$
    Float A = alpha + beta + gamma - Pi;
    if (A <= 0)
        return {};
    if (pdf != nullptr)
        *pdf = 1 / A;
    Float Ap = u[0] * A;

    // Compute $\sin \beta'$ and $\cos \beta'$ for point along _b_ for sampled area
    Float cosAlpha = std::cos(alpha), sinAlpha = std::sin(alpha);

    Float sinPhi = std::sin(Ap) * cosAlpha - std::cos(Ap) * sinAlpha;
    Float cosPhi = std::cos(Ap) * cosAlpha + std::sin(Ap) * sinAlpha;

    Float uu = cosPhi - cosAlpha;
    Float vv = sinPhi + sinAlpha * Dot(a, b) /* cos c */;
    Float cosBetap = (((vv * cosPhi - uu * sinPhi) * cosAlpha - vv) /
                      ((vv * sinPhi + uu * cosPhi) * sinAlpha));
    // Happens if the triangle basically covers the entire hemisphere.
    // We currently depend on calling code to detect this case, which
    // is sort of ugly/unfortunate.
    CHECK(!IsNaN(cosBetap));
    cosBetap = Clamp(cosBetap, -1, 1);
    Float sinBetap = SafeSqrt(1 - cosBetap * cosBetap);

    // Compute $c'$ along the arc between $b'$ and $a$
    Vector3f cp = cosBetap * a + sinBetap * Normalize(GramSchmidt(c, a));

    // Compute sampled spherical triangle direction and return barycentrics
    Float cosTheta = 1 - u[1] * (1 - Dot(cp, b));
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f w = cosTheta * b + sinTheta * Normalize(GramSchmidt(cp, b));
    // Find barycentric coordinates for sampled direction _w_
    Vector3f e1(v[1] - v[0]), e2(v[2] - v[0]);
    Vector3f s1 = Cross(w, e2);
    Float divisor = Dot(s1, e1);
    CHECK_RARE(1e-6, divisor == 0);
    if (divisor == 0) {
        // This happens with triangles that cover (nearly) the whole
        // hemisphere.
        return {1.f / 3.f, 1.f / 3.f, 1.f / 3.f};
    }
    Float invDivisor = 1 / divisor;
    Vector3f s(p - v[0]);
    Float b1 = Dot(s, s1) * invDivisor;
    Vector3f s2 = Cross(s, e1);
    Float b2 = Dot(w, s2) * invDivisor;

    // Return clamped barycentrics for sampled direction
    b1 = Clamp(b1, 0, 1);
    b2 = Clamp(b2, 0, 1);
    if (b1 + b2 > 1) {
        b1 /= b1 + b2;
        b2 /= b1 + b2;
    }
    return {Float(1 - b1 - b2), Float(b1), Float(b2)};
}